

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wirehair.cpp
# Opt level: O0

char * wirehair_result_string(WirehairResult result)

{
  WirehairResult result_local;
  char *local_8;
  
  switch(result) {
  case Wirehair_Success:
    local_8 = "Wirehair_Success";
    break;
  case Wirehair_NeedMore:
    local_8 = "Wirehair_NeedMore";
    break;
  case Wirehair_InvalidInput:
    local_8 = "Wirehair_InvalidInput";
    break;
  case Wirehair_BadDenseSeed:
    local_8 = "Wirehair_BadDenseSeed";
    break;
  case Wirehair_BadPeelSeed:
    local_8 = "Wirehair_BadPeelSeed";
    break;
  case Wirehair_BadInput_SmallN:
    local_8 = "Wirehair_BadInput_SmallN";
    break;
  case Wirehair_BadInput_LargeN:
    local_8 = "Wirehair_BadInput_LargeN";
    break;
  case Wirehair_ExtraInsufficient:
    local_8 = "Wirehair_ExtraInsufficient";
    break;
  default:
    local_8 = "Unknown";
    break;
  case Wirehair_OOM:
    local_8 = "Wirehair_OOM";
    break;
  case Wirehair_UnsupportedPlatform:
    local_8 = "Wirehair_UnsupportedPlatform";
  }
  return local_8;
}

Assistant:

WIREHAIR_EXPORT const char *wirehair_result_string(
    WirehairResult result ///< Result code to convert to string
)
{
    static_assert(WirehairResult_Count == 11, "Update this switch too");

    switch (result)
    {
    case Wirehair_Success:           return "Wirehair_Success";
    case Wirehair_NeedMore:    return "Wirehair_NeedMore";
    case Wirehair_BadDenseSeed:      return "Wirehair_BadDenseSeed";
    case Wirehair_BadPeelSeed:       return "Wirehair_BadPeelSeed";
    case Wirehair_BadInput_SmallN:   return "Wirehair_BadInput_SmallN";
    case Wirehair_BadInput_LargeN:   return "Wirehair_BadInput_LargeN";
    case Wirehair_ExtraInsufficient: return "Wirehair_ExtraInsufficient";
    case Wirehair_InvalidInput:      return "Wirehair_InvalidInput";
    case Wirehair_OOM:               return "Wirehair_OOM";
    case Wirehair_UnsupportedPlatform: return "Wirehair_UnsupportedPlatform";
    default:
        break;
    }

    return "Unknown";
}